

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeFilteringTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *poVar1;
  FilterMode FVar2;
  FilterMode FVar3;
  TestLog *pTVar4;
  TestContext *pTVar5;
  bool bVar6;
  int iVar7;
  deUint32 width;
  deUint32 height;
  uint uVar8;
  TestTextureCube *pTVar9;
  undefined4 extraout_var;
  pointer pFVar10;
  long lVar11;
  undefined4 extraout_var_01;
  byte bVar12;
  CubeFace face;
  undefined1 auVar13 [16];
  LodPrecision lodPrecision;
  PixelFormat pixelFormat;
  vector<float,_std::allocator<float>_> texCoord;
  int *local_348;
  undefined1 local_338 [24];
  TextureFormat local_320;
  size_type sStack_318;
  BVec4 local_310;
  IVec4 formatBitDepth;
  Surface rendered;
  TextureFormat texFmt;
  IVec4 colorBits;
  undefined1 local_2b8 [32];
  int local_298;
  anon_union_16_3_1194ccdc_for_v aStack_294;
  undefined4 uStack_284;
  DepthStencilMode DStack_280;
  ConstPixelBufferAccess local_130;
  undefined1 local_104 [76];
  size_type sStack_b8;
  size_type local_b0;
  undefined8 uStack_a8;
  int local_a0;
  bool local_8c;
  undefined7 uStack_8b;
  LodMode local_84;
  TextureFormatInfo fmtInfo;
  undefined4 extraout_var_00;
  
  pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &this->m_renderer;
  pTVar9 = util::TextureRenderer::getCubeTexture
                     (this_00,(this->m_cases).
                              super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                              ._M_impl.super__Vector_impl_data._M_start[this->m_caseNdx].
                              textureIndex);
  iVar7 = (*(pTVar9->super_TestTexture)._vptr_TestTexture[0xe])();
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar7);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  pFVar10 = (this->m_cases).
            super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_104,TEXTURETYPE_CUBE);
  util::createSampler((Sampler *)local_2b8,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  local_a0 = local_298;
  local_b0 = local_2b8._16_8_;
  uStack_a8 = local_2b8._24_8_;
  local_104._68_8_ = local_2b8._0_8_;
  sStack_b8 = local_2b8._8_8_;
  uStack_8b = (undefined7)(CONCAT44(DStack_280,uStack_284) >> 8);
  local_8c = true;
  local_104._4_4_ = glu::TextureTestUtil::getSamplerType(texFmt);
  local_84 = LODMODE_EXACT;
  local_104._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_104._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_104._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_104._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_104._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_104._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_104._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_104._48_4_ = fmtInfo.lookupScale.m_data[3];
  poVar1 = (ostringstream *)(local_2b8 + 8);
  local_2b8._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Coordinates: ");
  tcu::operator<<((ostream *)poVar1,&pFVar10->bottomLeft);
  std::operator<<((ostream *)poVar1," -> ");
  tcu::operator<<((ostream *)poVar1,&pFVar10->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  face = CUBEFACE_NEGATIVE_X;
  local_348 = &DAT_009f0ab0;
  do {
    if (face == CUBEFACE_LAST) {
      iVar7 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar7;
      if (iVar7 < (int)(((long)(this->m_cases).
                               super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_cases).
                              super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x14)) {
        tcu::TestStatus::incomplete();
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2b8,"Pass",(allocator<char> *)local_338);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_2b8);
        std::__cxx11::string::~string((string *)local_2b8);
      }
      return __return_storage_ptr__;
    }
    width = util::TextureRenderer::getRenderWidth(this_00);
    height = util::TextureRenderer::getRenderHeight(this_00);
    tcu::Surface::Surface(&rendered,width,height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar10->bottomLeft,&pFVar10->topRight);
    poVar1 = (ostringstream *)(local_2b8 + 8);
    local_2b8._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Face ");
    std::operator<<((ostream *)poVar1,(char *)((long)&DAT_009f0ab0 + (long)*local_348));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    util::TextureRenderer::renderQuad
              (this_00,&rendered,pFVar10->textureIndex,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_104);
    FVar2 = (this->m_testParameters).super_TextureCubeTestCaseParameters.
            super_TextureCommonTestCaseParameters.magFilter;
    FVar3 = (this->m_testParameters).super_TextureCubeTestCaseParameters.
            super_TextureCommonTestCaseParameters.minFilter;
    local_2b8._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_2b8);
    pixelFormat.redBits = formatBitDepth.m_data[0];
    pixelFormat.greenBits = formatBitDepth.m_data[1];
    pixelFormat.blueBits = formatBitDepth.m_data[2];
    pixelFormat.alphaBits = formatBitDepth.m_data[3];
    local_338._8_4_ = formatBitDepth.m_data[2];
    local_338._12_4_ = formatBitDepth.m_data[3];
    tcu::operator-((tcu *)local_2b8,(Vector<int,_4> *)local_338,
                   (FVar2 != NEAREST || FVar3 != NEAREST) + 1);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_130,0);
    tcu::max<int,4>((tcu *)&colorBits,(Vector<int,_4> *)local_2b8,(Vector<int,_4> *)&local_130);
    lodPrecision.rule = RULE_VULKAN;
    lodPrecision.derivateBits = 0x16;
    lodPrecision.lodBits = 0x10;
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_338);
    poVar1 = (ostringstream *)(local_2b8 + 8);
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)&local_130,&colorBits);
    tcu::operator/((tcu *)local_2b8,(Vector<float,_4> *)&local_130,
                   (Vector<float,_4> *)(local_104 + 0x24));
    local_320.order = local_2b8._0_4_;
    local_320.type = local_2b8._4_4_;
    sStack_318 = local_2b8._8_8_;
    local_338._0_4_ = 10;
    local_338._4_4_ = 10;
    local_338._8_4_ = 10;
    local_338._12_4_ = 6;
    local_338._16_4_ = 6;
    local_338._20_4_ = 0;
    auVar13._0_4_ = -(uint)(0 < pixelFormat.redBits);
    auVar13._4_4_ = -(uint)(0 < pixelFormat.greenBits);
    auVar13._8_4_ = -(uint)(0 < pixelFormat.blueBits);
    auVar13._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
    uVar8 = movmskps((int)&local_320,auVar13);
    bVar12 = (byte)uVar8;
    local_310.m_data =
         (bool  [4])
         (uVar8 & 1 | (uint)((bVar12 & 2) >> 1) << 8 | (uint)((bVar12 & 4) >> 2) << 0x10 |
         (uint)(bVar12 >> 3) << 0x18);
    pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_130,&rendered);
    iVar7 = (*(pTVar9->super_TestTexture)._vptr_TestTexture[0x10])();
    lVar11 = CONCAT44(extraout_var_00,iVar7);
    aStack_294.uData[3] = (deUint32)*(undefined8 *)(lVar11 + 0x160);
    uStack_284 = (undefined4)((ulong)*(undefined8 *)(lVar11 + 0x160) >> 0x20);
    local_2b8._0_8_ = *(undefined8 *)(lVar11 + 0x130);
    local_2b8._8_8_ = *(size_type *)(lVar11 + 0x138);
    local_2b8._16_8_ = *(size_type *)(lVar11 + 0x140);
    local_2b8._24_8_ = *(undefined8 *)(lVar11 + 0x148);
    local_298 = (int)*(undefined8 *)(lVar11 + 0x150);
    aStack_294.uData[0] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x150) >> 0x20);
    aStack_294.uData[1] = (deUint32)*(undefined8 *)(lVar11 + 0x158);
    aStack_294.uData[2] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x158) >> 0x20);
    bVar6 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar5,&local_130,(TextureCubeView *)local_2b8,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_104,
                       (LookupPrecision *)local_338,&lodPrecision,&pixelFormat);
    if (!bVar6) {
      lodPrecision.lodBits = 4;
      local_338._12_4_ = 4;
      local_338._16_4_ = 4;
      local_338._20_4_ = 0;
      local_2b8._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Warning: Verification against high precision requirements failed, trying with lower requirements."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)&local_130,&rendered);
      iVar7 = (*(pTVar9->super_TestTexture)._vptr_TestTexture[0x10])();
      lVar11 = CONCAT44(extraout_var_01,iVar7);
      aStack_294.uData[3] = (deUint32)*(undefined8 *)(lVar11 + 0x160);
      uStack_284 = (undefined4)((ulong)*(undefined8 *)(lVar11 + 0x160) >> 0x20);
      local_2b8._0_8_ = *(undefined8 *)(lVar11 + 0x130);
      local_2b8._8_8_ = *(size_type *)(lVar11 + 0x138);
      local_2b8._16_8_ = *(size_type *)(lVar11 + 0x140);
      local_2b8._24_8_ = *(undefined8 *)(lVar11 + 0x148);
      local_298 = (int)*(undefined8 *)(lVar11 + 0x150);
      aStack_294.uData[0] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x150) >> 0x20);
      aStack_294.uData[1] = (deUint32)*(undefined8 *)(lVar11 + 0x158);
      aStack_294.uData[2] = (deUint32)((ulong)*(undefined8 *)(lVar11 + 0x158) >> 0x20);
      bVar6 = glu::TextureTestUtil::verifyTextureResult
                        (pTVar5,&local_130,(TextureCubeView *)local_2b8,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_104,
                         (LookupPrecision *)local_338,&lodPrecision,&pixelFormat);
      if (!bVar6) {
        poVar1 = (ostringstream *)(local_2b8 + 8);
        local_2b8._0_8_ = pTVar4;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "ERROR: Verification against low precision requirements failed, failing test case."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2b8,"Image verification failed",(allocator<char> *)&local_130);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_2b8);
        std::__cxx11::string::~string((string *)local_2b8);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
        tcu::Surface::~Surface(&rendered);
        return __return_storage_ptr__;
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
    tcu::Surface::~Surface(&rendered);
    face = face + CUBEFACE_POSITIVE_X;
    local_348 = local_348 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus TextureCubeFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const pipeline::TestTextureCube&	texture		= m_renderer.getCubeTexture(m_cases[m_caseNdx].textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&					curCase		= m_cases[m_caseNdx];
	ReferenceParams						refParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	refParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.lodMode					= LODMODE_EXACT;
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;

	log << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(rendered, curCase.textureIndex, &texCoord[0], refParams);

		{
			const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
			const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
														   &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
													  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}